

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O0

BYTE * EmitLEB128(BYTE *pc,uint value)

{
  byte *pbVar1;
  byte local_15;
  uint local_14;
  BYTE b;
  byte *pbStack_10;
  uint value_local;
  BYTE *pc_local;
  
  local_14 = value;
  pbStack_10 = pc;
  do {
    local_15 = (byte)local_14 & 0x7f;
    local_14 = local_14 >> 7;
    if (local_14 != 0) {
      local_15 = local_15 | 0x80;
    }
    pbVar1 = pbStack_10 + 1;
    *pbStack_10 = local_15;
    pbStack_10 = pbVar1;
  } while (local_14 != 0);
  return pbVar1;
}

Assistant:

BYTE* EmitLEB128(BYTE* pc, unsigned value)
{
    do
    {
        BYTE b = value & 0x7F; // low order 7 bits
        value >>= 7;

        if (value)  // more bytes to come
        {
            b |= 0x80;
        }

        *pc++ = b;
    }
    while (value != 0);

    return pc;
}